

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpi_enc_utils.c
# Opt level: O2

RK_S32 mpi_enc_opt_speed(void *ctx,char *next)

{
  uint uVar1;
  RK_S32 RVar2;
  
  if (next == (char *)0x0) {
    RVar2 = 0;
    _mpp_log_l(2,"mpi_enc_utils","invalid speed mode\n",0);
  }
  else {
    uVar1 = atoi(next);
    *(uint *)((long)ctx + 0xd8) = uVar1;
    RVar2 = 1;
    if (3 < uVar1) {
      *(undefined4 *)((long)ctx + 0xd8) = 0;
      _mpp_log_l(2,"mpi_enc_utils","invalid speed %d set to default 0\n",0,0);
    }
  }
  return RVar2;
}

Assistant:

RK_S32 mpi_enc_opt_speed(void *ctx, const char *next)
{
    MpiEncTestArgs *cmd = (MpiEncTestArgs *)ctx;

    if (next) {
        cmd->speed = atoi(next);
        if (cmd->speed > 3 || cmd->speed < 0) {
            cmd->speed = 0;
            mpp_err("invalid speed %d set to default 0\n", cmd->speed);
        }
        return 1;
    }

    mpp_err("invalid speed mode\n");
    return 0;
}